

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
covenant::CFG::getNullablePositions
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,CFG *this,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *SymVec,
          set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
          *NullableSymbols)

{
  iterator __position;
  pointer pSVar1;
  size_type sVar2;
  ulong uVar3;
  uint local_24;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_24 = 0;
  pSVar1 = (SymVec->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((SymVec->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    uVar3 = 0;
    do {
      sVar2 = std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::
              count(NullableSymbols,pSVar1 + uVar3);
      if (sVar2 != 0) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     __position,&local_24);
        }
        else {
          *__position._M_current = local_24;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_24 = local_24 + 1;
      uVar3 = (ulong)local_24;
      pSVar1 = (SymVec->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(SymVec->
                                   super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 2))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned>  
    getNullablePositions(const vector<Sym> &SymVec, 
                         const set<Sym> &NullableSymbols)
    {
      vector<unsigned> positions;
      for (unsigned i=0; i < SymVec.size() ; i++)
      {		
        if (NullableSymbols.count(SymVec[i]) > 0)
          positions.push_back(i);
      }
      return positions;
    }